

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bezier.cpp
# Opt level: O0

pair<Polynomial,_Polynomial> * __thiscall Bezier::P2d(Bezier *this,int l,int n)

{
  reference pvVar1;
  int in_ECX;
  int in_EDX;
  pair<Polynomial,_Polynomial> *in_RSI;
  pair<Polynomial,_Polynomial> *in_RDI;
  pair<Polynomial,_Polynomial> rhs;
  pair<Polynomial,_Polynomial> lhs;
  pair<Polynomial,_Polynomial> *__x;
  double *in_stack_fffffffffffffe88;
  pair<Polynomial,_Polynomial> *in_stack_fffffffffffffe90;
  double in_stack_fffffffffffffea0;
  double in_stack_fffffffffffffea8;
  Polynomial *in_stack_fffffffffffffeb0;
  Polynomial *in_stack_fffffffffffffeb8;
  Polynomial *in_stack_fffffffffffffed0;
  Polynomial *in_stack_fffffffffffffed8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  if (in_ECX == 1) {
    pvVar1 = std::vector<Vector3,_std::allocator<Vector3>_>::operator[]
                       ((vector<Vector3,_std::allocator<Vector3>_> *)
                        &in_RSI[7].second.c.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_EDX);
    Vector3::operator[](pvVar1,0);
    pvVar1 = std::vector<Vector3,_std::allocator<Vector3>_>::operator[]
                       ((vector<Vector3,_std::allocator<Vector3>_> *)
                        &in_RSI[7].second.c.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_EDX);
    Vector3::operator[](pvVar1,1);
    std::pair<Polynomial,_Polynomial>::pair<double_&,_double_&,_true>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(double *)in_RSI);
    __x = in_RDI;
  }
  else {
    __x = in_RDI;
    P2d((Bezier *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    P2d((Bezier *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    Polynomial::Polynomial
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    Polynomial::operator*(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    Polynomial::Polynomial
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    Polynomial::operator*(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    Polynomial::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    Polynomial::Polynomial
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    Polynomial::operator*(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    Polynomial::Polynomial
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    Polynomial::operator*(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    Polynomial::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::pair<Polynomial,_Polynomial>::pair<Polynomial,_Polynomial,_true>
              (in_RSI,&__x->first,&in_RDI->first);
    Polynomial::~Polynomial((Polynomial *)0x12beb1);
    Polynomial::~Polynomial((Polynomial *)0x12bebb);
    Polynomial::~Polynomial((Polynomial *)0x12bec5);
    Polynomial::~Polynomial((Polynomial *)0x12becf);
    Polynomial::~Polynomial((Polynomial *)0x12bed9);
    Polynomial::~Polynomial((Polynomial *)0x12bee6);
    Polynomial::~Polynomial((Polynomial *)0x12bef3);
    Polynomial::~Polynomial((Polynomial *)0x12bf00);
    Polynomial::~Polynomial((Polynomial *)0x12bf0d);
    Polynomial::~Polynomial((Polynomial *)0x12bf1a);
    std::pair<Polynomial,_Polynomial>::~pair(in_RDI);
    std::pair<Polynomial,_Polynomial>::~pair(in_RDI);
  }
  return __x;
}

Assistant:

std::pair<Polynomial, Polynomial> Bezier::P2d(int l, int n)
{
    if (n == 1)
        return std::pair<Polynomial, Polynomial>(control_points[l][0], control_points[l][1]);
    std::pair<Polynomial, Polynomial> lhs = P2d(l, n - 1), rhs = P2d(l + 1, n - 1);
    return std::pair<Polynomial, Polynomial>(Polynomial(1, -1) * lhs.first  + Polynomial(0, 1) * rhs.first,
                                             Polynomial(1, -1) * lhs.second + Polynomial(0, 1) * rhs.second);
}